

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

void __thiscall
QPDF::processMemoryFile(QPDF *this,char *description,char *buf,size_t length,char *password)

{
  BufferInputSource *this_00;
  Buffer *this_01;
  uchar *buf_00;
  allocator<char> local_69;
  char *local_68;
  shared_ptr<InputSource> local_60;
  string local_50;
  
  local_68 = password;
  this_00 = (BufferInputSource *)operator_new(0xe8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,description,&local_69);
  this_01 = (Buffer *)operator_new(8);
  buf_00 = QUtil::unsigned_char_pointer(buf);
  Buffer::Buffer(this_01,buf_00,length);
  BufferInputSource::BufferInputSource(this_00,&local_50,this_01,true);
  std::__shared_ptr<InputSource,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<BufferInputSource,void>
            ((__shared_ptr<InputSource,(__gnu_cxx::_Lock_policy)2> *)&local_60,this_00);
  processInputSource(this,&local_60,local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_60.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void
QPDF::processMemoryFile(
    char const* description, char const* buf, size_t length, char const* password)
{
    processInputSource(
        std::shared_ptr<InputSource>(
            // line-break
            new BufferInputSource(
                description, new Buffer(QUtil::unsigned_char_pointer(buf), length), true)),
        password);
}